

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::FullClassName<google::protobuf::EnumDescriptor>
                   (EnumDescriptor *desc,bool is_descriptor)

{
  ulong uVar1;
  byte in_DL;
  string *in_RDI;
  EnumDescriptor *in_stack_00000028;
  string php_namespace;
  string classname;
  string *__lhs;
  string local_88 [8];
  char *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff97;
  EnumDescriptor *in_stack_ffffffffffffff98;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  __lhs = in_RDI;
  GeneratedClassNameImpl<google::protobuf::EnumDescriptor>(in_stack_00000028);
  RootPhpNamespace<google::protobuf::EnumDescriptor>
            (in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+(__lhs,in_RDI);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,local_38);
  }
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return __lhs;
}

Assistant:

std::string FullClassName(const DescriptorType* desc, bool is_descriptor) {
  string classname = GeneratedClassNameImpl(desc);
  string php_namespace = RootPhpNamespace(desc, is_descriptor);
  if (!php_namespace.empty()) {
    return php_namespace + "\\" + classname;
  }
  return classname;
}